

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeListImpl.cpp
# Opt level: O1

XMLSize_t __thiscall xercesc_4_0::DOMNodeListImpl::getLength(DOMNodeListImpl *this)

{
  long *plVar1;
  long lVar2;
  DOMException *this_00;
  XMLSize_t XVar3;
  DOMNode *pDVar4;
  
  if ((this->fNode == (DOMParentNode *)0x0) ||
     (pDVar4 = this->fNode->fFirstChild, pDVar4 == (DOMNode *)0x0)) {
    XVar3 = 0;
  }
  else {
    XVar3 = 0;
    do {
      plVar1 = (long *)__dynamic_cast(pDVar4,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                      0xfffffffffffffffe);
      if ((plVar1 == (long *)0x0) || (lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1), lVar2 == 0)) {
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
        __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
      }
      lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
      pDVar4 = *(DOMNode **)(lVar2 + 8);
      XVar3 = XVar3 + 1;
    } while (pDVar4 != (DOMNode *)0x0);
  }
  return XVar3;
}

Assistant:

XMLSize_t DOMNodeListImpl::getLength() const{
    XMLSize_t count = 0;
    if (fNode) {
        DOMNode *node = fNode->fFirstChild;
        while(node != 0){
            ++count;
            node = castToChildImpl(node)->nextSibling;
        }
    }

    return count;
}